

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Input::bitSetMatch(Input *this,char *Str,bool param_2)

{
  ulong *puVar1;
  HNode *pHVar2;
  _func_int **pp_Var3;
  _func_int *__s1;
  _func_int *p_Var4;
  bool bVar5;
  int iVar6;
  _func_int *__n;
  char *__function;
  Node *pNVar7;
  uint uVar8;
  bool bVar9;
  Twine local_60;
  Node *local_48;
  Input *local_40;
  char *local_38;
  
  if ((this->EC)._M_value == 0) {
    pHVar2 = this->CurrentNode;
    if (pHVar2 == (HNode *)0x0) {
      __function = 
      "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
      ;
LAB_00dc5825:
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,__function);
    }
    if (pHVar2->_node->TypeID == 5) {
      pNVar7 = (Node *)pHVar2[1]._vptr_HNode;
      local_48 = pHVar2[1]._node;
      bVar9 = pNVar7 == local_48;
      if (!bVar9) {
        uVar8 = 0;
        local_40 = this;
        local_38 = Str;
        do {
          pp_Var3 = pNVar7->_vptr_Node;
          if (pp_Var3 == (_func_int **)0x0) {
            __function = 
            "static bool llvm::isa_impl_cl<llvm::yaml::Input::ScalarHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::ScalarHNode, From = const llvm::yaml::Input::HNode *]"
            ;
            goto LAB_00dc5825;
          }
          if (*(int *)(pp_Var3[1] + 0x20) - 3U < 0xfffffffe) {
            pHVar2 = this->CurrentNode;
            Twine::Twine(&local_60,"unexpected scalar in sequence of bit values");
            setError(this,pHVar2,&local_60);
          }
          else {
            __s1 = pp_Var3[2];
            p_Var4 = pp_Var3[3];
            if (local_38 == (char *)0x0) {
              __n = (_func_int *)0x0;
            }
            else {
              __n = (_func_int *)strlen(local_38);
              this = local_40;
            }
            if ((p_Var4 == __n) &&
               ((__n == (_func_int *)0x0 || (iVar6 = bcmp(__s1,local_38,(size_t)__n), iVar6 == 0))))
            {
              puVar1 = (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (uVar8 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
              bVar5 = true;
              goto LAB_00dc57f9;
            }
          }
          uVar8 = uVar8 + 1;
          pNVar7 = (Node *)&pNVar7->Doc;
          bVar9 = pNVar7 == local_48;
        } while (!bVar9);
      }
      bVar5 = false;
LAB_00dc57f9:
      if (!bVar9) {
        return bVar5;
      }
    }
    else {
      Twine::Twine(&local_60,"expected sequence of bit values");
      setError(this,pHVar2,&local_60);
    }
  }
  return false;
}

Assistant:

bool Input::bitSetMatch(const char *Str, bool) {
  if (EC)
    return false;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    unsigned Index = 0;
    for (auto &N : SQ->Entries) {
      if (ScalarHNode *SN = dyn_cast<ScalarHNode>(N.get())) {
        if (SN->value().equals(Str)) {
          BitValuesUsed[Index] = true;
          return true;
        }
      } else {
        setError(CurrentNode, "unexpected scalar in sequence of bit values");
      }
      ++Index;
    }
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  return false;
}